

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O0

void character_sleeps(tgestate_t *state,uint8_t routeindex,route_t *route)

{
  undefined8 in_RDX;
  room_t room_00;
  byte in_SIL;
  room_t room;
  int in_stack_ffffffffffffffd8;
  room_t in_stack_ffffffffffffffdf;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 uVar1;
  undefined7 in_stack_fffffffffffffff0;
  
  room_00 = (room_t)((ulong)in_RDX >> 0x38);
  set_roomdef((tgestate_t *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
              in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8,0);
  if (in_SIL < 10) {
    uVar1 = 3;
  }
  else {
    uVar1 = 5;
  }
  character_sit_sleep_common
            ((tgestate_t *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),room_00,
             (route_t *)CONCAT17(uVar1,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

void character_sleeps(tgestate_t *state,
                      uint8_t     routeindex,
                      route_t    *route)
{
  room_t room; /* was C */

  assert(state  != NULL);
  assert(routeindex >= routeindex_7_PRISONER_SLEEPS_1 &&
         routeindex <= routeindex_12_PRISONER_SLEEPS_3);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

  /* Poke object. */
  set_roomdef(state,
              beds[routeindex - 7].room_index,
              beds[routeindex - 7].offset,
              interiorobject_OCCUPIED_BED);

  if (routeindex < routeindex_10_PRISONER_SLEEPS_1)
    room = room_3_HUT2RIGHT;
  else
    room = room_5_HUT3RIGHT;

  character_sit_sleep_common(state, room, route); // was fallthrough
}